

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O3

bool chaiscript::dispatch::detail::
     call_func<chaiscript::dispatch::detail::Fun_Caller<bool,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>,bool,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&,0ul>
               (undefined8 param_1,undefined8 *param_2,undefined8 *param_3,
               Type_Conversions_State *param_4)

{
  undefined1 uVar1;
  chaiscript local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
            (local_20,(Boxed_Value *)*param_3,param_4);
  uVar1 = (*(code *)*param_2)(local_20);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return (bool)uVar1;
}

Assistant:

Ret call_func(const chaiscript::dispatch::detail::Function_Signature<Ret (Params...)> &, Indexes<I...>, const Callable &f,
            const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          (void)params; (void)t_conversions;
          return f(boxed_cast<Params>(params[I], &t_conversions)...);
        }